

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2padded_cell.cc
# Opt level: O1

void __thiscall S2PaddedCell::S2PaddedCell(S2PaddedCell *this,S2PaddedCell *parent,int i,int j)

{
  int position;
  double dVar1;
  VType VVar2;
  VType VVar3;
  VType VVar4;
  long lVar5;
  S2CellId SVar6;
  BasicVector<Vector2,_double,_2UL> *this_00;
  double *pdVar7;
  byte bVar8;
  S2LogMessage local_40;
  
  (this->id_).id_ = 0;
  this->padding_ = parent->padding_;
  VVar2 = (parent->bound_).bounds_[0].bounds_.c_[1];
  VVar3 = (parent->bound_).bounds_[1].bounds_.c_[0];
  VVar4 = (parent->bound_).bounds_[1].bounds_.c_[1];
  (this->bound_).bounds_[0].bounds_.c_[0] = (parent->bound_).bounds_[0].bounds_.c_[0];
  (this->bound_).bounds_[0].bounds_.c_[1] = VVar2;
  (this->bound_).bounds_[1].bounds_.c_[0] = VVar3;
  (this->bound_).bounds_[1].bounds_.c_[1] = VVar4;
  lVar5 = 0x38;
  do {
    *(undefined8 *)((long)(this->bound_).bounds_[0].bounds_.c_ + lVar5 + -0x18) = 0x3ff0000000000000
    ;
    *(undefined8 *)((long)((this->bound_).bounds_ + -1) + lVar5) = 0;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x58);
  if ((this->middle_).bounds_[1].bounds_.c_[0] <= (this->middle_).bounds_[1].bounds_.c_[1] !=
      (this->middle_).bounds_[0].bounds_.c_[1] < (this->middle_).bounds_[0].bounds_.c_[0]) {
    this->level_ = parent->level_ + 1;
    position = *(int *)(S2::internal::kIJtoPos +
                       (long)(j + i * 2) * 4 + (long)parent->orientation_ * 0x10);
    SVar6 = S2CellId::child(&parent->id_,position);
    (this->id_).id_ = SVar6.id_;
    bVar8 = 0x1e - (char)this->level_;
    this->ij_lo_[0] = (i << (bVar8 & 0x1f)) + parent->ij_lo_[0];
    this->ij_lo_[1] = (j << (bVar8 & 0x1f)) + parent->ij_lo_[1];
    this->orientation_ =
         *(uint *)(&S2::internal::kPosToOrientation + (long)position * 4) ^ parent->orientation_;
    this_00 = (BasicVector<Vector2,_double,_2UL> *)middle(parent);
    dVar1 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                      (this_00,1 - i);
    pdVar7 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                       ((BasicVector<Vector2,_double,_2UL> *)&this->bound_,1 - i);
    *pdVar7 = dVar1;
    dVar1 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                      (this_00 + 0x10,1 - j);
    pdVar7 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                       ((BasicVector<Vector2,_double,_2UL> *)((this->bound_).bounds_ + 1),1 - j);
    *pdVar7 = dVar1;
    return;
  }
  S2LogMessage::S2LogMessage
            (&local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/r2rect.h"
             ,0xb1,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_40.stream_,"Check failed: is_valid() ",0x19);
  abort();
}

Assistant:

S2PaddedCell::S2PaddedCell(const S2PaddedCell& parent, int i, int j)
    : padding_(parent.padding_),
      bound_(parent.bound_),
      level_(parent.level_ + 1) {
  // Compute the position and orientation of the child incrementally from the
  // orientation of the parent.
  int pos = kIJtoPos[parent.orientation_][2*i+j];
  id_ = parent.id_.child(pos);
  int ij_size = S2CellId::GetSizeIJ(level_);
  ij_lo_[0] = parent.ij_lo_[0] + i * ij_size;
  ij_lo_[1] = parent.ij_lo_[1] + j * ij_size;
  orientation_ = parent.orientation_ ^ kPosToOrientation[pos];
  // For each child, one corner of the bound is taken directly from the parent
  // while the diagonally opposite corner is taken from middle().
  const R2Rect& middle = parent.middle();
  bound_[0][1-i] = middle[0][1-i];
  bound_[1][1-j] = middle[1][1-j];
}